

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O3

void __thiscall
BamTools::Internal::BamStandardIndex::SummarizeLinearOffsets
          (BamStandardIndex *this,BaiReferenceSummary *refSummary)

{
  int iVar1;
  undefined4 extraout_var;
  int numLinearOffsets;
  uint bytesRequested;
  int local_20;
  uint local_1c;
  
  ReadNumLinearOffsets(this,&local_20);
  refSummary->NumLinearOffsets = local_20;
  iVar1 = (*((this->m_resources).Device)->_vptr_IBamIODevice[7])();
  refSummary->FirstLinearOffsetFilePosition = CONCAT44(extraout_var,iVar1);
  local_1c = local_20 << 3;
  ReadIntoBuffer(this,&local_1c);
  return;
}

Assistant:

void BamStandardIndex::SummarizeLinearOffsets(BaiReferenceSummary& refSummary) {

    // load number of linear offsets
    int numLinearOffsets;
    ReadNumLinearOffsets(numLinearOffsets);

    // store bin summary data for this reference
    refSummary.NumLinearOffsets = numLinearOffsets;
    refSummary.FirstLinearOffsetFilePosition = Tell();

    // skip linear offsets in index file
    SkipLinearOffsets(numLinearOffsets);
}